

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O3

GLMClassifier_DoubleArray *
google::protobuf::Arena::CreateMessageInternal<CoreML::Specification::GLMClassifier_DoubleArray>
          (Arena *arena)

{
  GLMClassifier_DoubleArray *this;
  
  if (arena == (Arena *)0x0) {
    this = (GLMClassifier_DoubleArray *)operator_new(0x28);
    CoreML::Specification::GLMClassifier_DoubleArray::GLMClassifier_DoubleArray
              (this,(Arena *)0x0,false);
  }
  else {
    this = (GLMClassifier_DoubleArray *)
           AllocateAlignedWithHook
                     (arena,0x28,
                      (type_info *)&CoreML::Specification::GLMClassifier_DoubleArray::typeinfo);
    CoreML::Specification::GLMClassifier_DoubleArray::GLMClassifier_DoubleArray(this,arena,false);
  }
  return this;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }